

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_CustomMeleeAttack
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  AActor *self;
  int iVar6;
  AActor *pAVar7;
  char *pcVar8;
  int iVar9;
  bool bVar10;
  FSoundID local_44;
  FName local_40;
  FSoundID local_3c;
  DAngle local_38;
  PClass *pPVar5;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar8 = "(paramnum) < numparam";
    goto LAB_003ccbbd;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003ccbad:
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003ccbbd:
    __assert_fail(pcVar8,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x6a9,
                  "int AF_AActor_A_CustomMeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  self = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (self == (AActor *)0x0) goto LAB_003cc9ab;
    pPVar5 = (self->super_DThinker).super_DObject.Class;
    if (pPVar5 == (PClass *)0x0) {
      iVar2 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
      pPVar5 = (PClass *)CONCAT44(extraout_var,iVar2);
      (self->super_DThinker).super_DObject.Class = pPVar5;
    }
    bVar10 = pPVar5 != (PClass *)0x0;
    if (pPVar5 != pPVar1 && bVar10) {
      do {
        pPVar5 = pPVar5->ParentClass;
        bVar10 = pPVar5 != (PClass *)0x0;
        if (pPVar5 == pPVar1) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    if (!bVar10) {
      pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003ccbbd;
    }
  }
  else {
    if (self != (AActor *)0x0) goto LAB_003ccbad;
LAB_003cc9ab:
    self = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ccc4b:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x6aa,
                    "int AF_AActor_A_CustomMeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar2 = param[1].field_0.i;
LAB_003cc9fd:
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ccc6a:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x6ab,
                    "int AF_AActor_A_CustomMeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar4 = param[2].field_0.i;
LAB_003cca0c:
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ccc1a:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x6ac,
                    "int AF_AActor_A_CustomMeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar6 = param[3].field_0.i;
LAB_003cca1b:
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ccbfb:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x6ad,
                    "int AF_AActor_A_CustomMeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar3 = param[4].field_0.i;
LAB_003cca2a:
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003ccbdc:
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x6ae,
                    "int AF_AActor_A_CustomMeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    if (param[1].field_0.field_3.Type != '\0') {
      pcVar8 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ccc4b;
    }
    iVar2 = param[1].field_0.i;
    if (numparam < 3) {
      param = defaultparam->Array;
      goto LAB_003cc9fd;
    }
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar8 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ccc6a;
    }
    iVar4 = param[2].field_0.i;
    if (numparam == 3) {
      param = defaultparam->Array;
      goto LAB_003cca0c;
    }
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar8 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ccc1a;
    }
    iVar6 = param[3].field_0.i;
    if ((uint)numparam < 5) {
      param = defaultparam->Array;
      goto LAB_003cca1b;
    }
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar8 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ccbfb;
    }
    iVar3 = param[4].field_0.i;
    if (numparam == 5) {
      param = defaultparam->Array;
      goto LAB_003cca2a;
    }
    if (param[5].field_0.field_3.Type != '\0') {
      pcVar8 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003ccbdc;
    }
  }
  iVar9 = 0x89;
  if (iVar3 != 0) {
    iVar9 = iVar3;
  }
  pAVar7 = (self->target).field_0.p;
  if (pAVar7 == (AActor *)0x0) {
    return 0;
  }
  if (((pAVar7->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (self->target).field_0.p = (AActor *)0x0;
    return 0;
  }
  iVar3 = param[5].field_0.i;
  A_FaceTarget(self);
  bVar10 = AActor::CheckMeleeRange(self);
  if (!bVar10) {
    if (iVar6 == 0) {
      return 0;
    }
    local_44.ID = iVar6;
    S_Sound(self,1,&local_44,1.0,1.0);
    return 0;
  }
  if (iVar4 != 0) {
    local_3c.ID = iVar4;
    S_Sound(self,1,&local_3c,1.0,1.0);
  }
  pAVar7 = (self->target).field_0.p;
  if (pAVar7 == (AActor *)0x0) {
LAB_003ccabc:
    pAVar7 = (AActor *)0x0;
  }
  else if (((pAVar7->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    (self->target).field_0.p = (AActor *)0x0;
    goto LAB_003ccabc;
  }
  local_38.Degrees = 0.0;
  local_40.Index = iVar9;
  iVar4 = P_DamageMobj(pAVar7,self,self,iVar2,&local_40,0,&local_38);
  if (iVar3 == 0) {
    return 0;
  }
  if (0 < iVar4) {
    iVar2 = iVar4;
  }
  pAVar7 = (self->target).field_0.p;
  if (pAVar7 != (AActor *)0x0) {
    if (((pAVar7->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_003ccb11;
    (self->target).field_0.p = (AActor *)0x0;
  }
  pAVar7 = (AActor *)0x0;
LAB_003ccb11:
  P_TraceBleed(iVar2,pAVar7,self);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CustomMeleeAttack)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF	(damage);
	PARAM_SOUND_DEF	(meleesound);
	PARAM_SOUND_DEF	(misssound);
	PARAM_NAME_DEF	(damagetype);
	PARAM_BOOL_DEF	(bleed);

	if (damagetype == NAME_None)
		damagetype = NAME_Melee;	// Melee is the default type

	if (!self->target)
		return 0;
				
	A_FaceTarget (self);
	if (self->CheckMeleeRange ())
	{
		if (meleesound)
			S_Sound (self, CHAN_WEAPON, meleesound, 1, ATTN_NORM);
		int newdam = P_DamageMobj (self->target, self, self, damage, damagetype);
		if (bleed)
			P_TraceBleed (newdam > 0 ? newdam : damage, self->target, self);
	}
	else
	{
		if (misssound)
			S_Sound (self, CHAN_WEAPON, misssound, 1, ATTN_NORM);
	}
	return 0;
}